

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header_detection.cpp
# Opt level: O3

string * duckdb::TrimWhitespace(string *__return_storage_ptr__,string *col_name)

{
  utf8proc_uint8_t *puVar1;
  ulong uVar2;
  utf8proc_category_t uVar3;
  long lVar4;
  utf8proc_ssize_t uVar5;
  unsigned_long uVar6;
  string *psVar7;
  ulong uVar8;
  utf8proc_int32_t codepoint;
  utf8proc_int32_t local_44;
  pointer local_40;
  string *local_38;
  
  uVar2 = col_name->_M_string_length;
  if (uVar2 != 0) {
    local_40 = (col_name->_M_dataplus)._M_p;
    uVar8 = 0;
    do {
      puVar1 = (utf8proc_uint8_t *)(local_40 + uVar8);
      lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar2 - uVar8);
      uVar5 = utf8proc_iterate(puVar1,lVar4,&local_44);
      uVar3 = utf8proc_category(local_44);
      if (uVar3 != UTF8PROC_CATEGORY_ZS) break;
      uVar6 = NumericCastImpl<unsigned_long,_long,_false>::Convert(uVar5);
      uVar8 = uVar8 + uVar6;
    } while (uVar8 < uVar2);
    psVar7 = __return_storage_ptr__;
    if (uVar8 < col_name->_M_string_length) {
      do {
        local_38 = psVar7;
        puVar1 = (utf8proc_uint8_t *)(local_40 + uVar8);
        lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar2 - uVar8);
        uVar5 = utf8proc_iterate(puVar1,lVar4,&local_44);
        uVar6 = NumericCastImpl<unsigned_long,_long,_false>::Convert(uVar5);
        uVar8 = uVar8 + uVar6;
        utf8proc_category(local_44);
        __return_storage_ptr__ = local_38;
        psVar7 = local_38;
      } while (uVar8 < col_name->_M_string_length);
    }
  }
  psVar7 = (string *)::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)col_name);
  return psVar7;
}

Assistant:

static string TrimWhitespace(const string &col_name) {
	utf8proc_int32_t codepoint;
	const auto str = reinterpret_cast<const utf8proc_uint8_t *>(col_name.c_str());
	const idx_t size = col_name.size();
	// Find the first character that is not left trimmed
	idx_t begin = 0;
	while (begin < size) {
		auto bytes = utf8proc_iterate(str + begin, NumericCast<utf8proc_ssize_t>(size - begin), &codepoint);
		D_ASSERT(bytes > 0);
		if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
			break;
		}
		begin += NumericCast<idx_t>(bytes);
	}

	// Find the last character that is not right trimmed
	idx_t end = begin;
	for (auto next = begin; next < col_name.size();) {
		auto bytes = utf8proc_iterate(str + next, NumericCast<utf8proc_ssize_t>(size - next), &codepoint);
		D_ASSERT(bytes > 0);
		next += NumericCast<idx_t>(bytes);
		if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
			end = next;
		}
	}

	// return the trimmed string
	return col_name.substr(begin, end - begin);
}